

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clCommandSVMMemcpyKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,void *dst_ptr,void *src_ptr,size_t size,
                 cl_uint num_sync_points_in_wait_list,cl_sync_point_khr *sync_point_wait_list,
                 cl_sync_point_khr *sync_point,cl_mutable_command_khr *mutable_handle)

{
  time_point end;
  cl_int cVar1;
  CLIntercept *this;
  CLIntercept *this_00;
  char *enqueueCounter_00;
  SConfig *pSVar2;
  undefined8 uVar3;
  time_point tickStart;
  CLIntercept *this_01;
  SConfig *pSVar4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RCX;
  cl_command_properties_khr *in_RDX;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  void *in_R8;
  size_t in_R9;
  cl_uint in_stack_00000008;
  cl_sync_point_khr *in_stack_00000010;
  cl_sync_point_khr *in_stack_00000018;
  cl_mutable_command_khr *in_stack_00000020;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  string syncPointWaitList;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd80;
  CLIntercept *in_stack_fffffffffffffd88;
  CLIntercept *in_stack_fffffffffffffd90;
  cl_sync_point_khr *in_stack_fffffffffffffd98;
  cl_uint in_stack_fffffffffffffda4;
  CLIntercept *in_stack_fffffffffffffda8;
  CLIntercept *in_stack_fffffffffffffdc8;
  CLIntercept *in_stack_fffffffffffffdd0;
  SConfig *in_stack_fffffffffffffdf0;
  SConfig *in_stack_fffffffffffffdf8;
  SConfig *in_stack_fffffffffffffe00;
  cl_uint num_sync_points_in_wait_list_00;
  SConfig *in_stack_fffffffffffffe08;
  CLIntercept *in_stack_fffffffffffffe18;
  undefined1 includeId;
  CLIntercept *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  CLIntercept *in_stack_fffffffffffffe30;
  time_point in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe48;
  time_point in_stack_fffffffffffffe50;
  int local_15c [6];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [55];
  undefined1 local_e1 [45];
  int local_b4;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  string local_88 [28];
  cl_int in_stack_ffffffffffffff94;
  char *functionName;
  cl_int local_1c;
  
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (this_00 = (CLIntercept *)
                CLIntercept::dispatchX
                          (in_stack_fffffffffffffd90,
                           (cl_command_buffer_khr)in_stack_fffffffffffffd88),
     (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_void_ptr_void_ptr_size_t_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
      *)(this_00->m_Dispatch).clRetainContext ==
     (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_void_ptr_void_ptr_size_t_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
      *)0x0)) {
    local_15c[0] = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_15c);
    local_1c = -0x472;
  }
  else {
    enqueueCounter_00 = (char *)CLIntercept::getEnqueueCounter(in_stack_fffffffffffffd88);
    getFormattedSyncPointWaitList_abi_cxx11_
              (in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffd98);
    pSVar2 = CLIntercept::config(this);
    functionName = enqueueCounter_00;
    if ((pSVar2->CallLogging & 1U) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffd80 = in_RCX;
      CLIntercept::callLoggingEnter
                (this,"clCommandSVMMemcpyKHR",(uint64_t)enqueueCounter_00,(cl_kernel)0x0,
                 "command_buffer = %p, command_queue = %p, dst_ptr = %p, src_ptr = %p, size = %zu%s"
                 ,in_RDI,in_RSI,in_RCX,in_R8,in_R9,uVar3);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffd80);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffd80);
    pSVar2 = CLIntercept::config(this);
    if (((pSVar2->HostPerformanceTiming & 1U) != 0) ||
       (in_stack_fffffffffffffe50.__d.__r = (duration)CLIntercept::config(this),
       (((SConfig *)in_stack_fffffffffffffe50.__d.__r)->ChromeCallLogging & 1U) != 0)) {
      local_b0 = std::chrono::_V2::steady_clock::now();
      local_a0 = local_b0;
    }
    cVar1 = (*(this_00->m_Dispatch).clRetainContext)
                      ((cl_command_buffer_khr)in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                       in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
    local_b4 = cVar1;
    tickStart.__d.__r = (duration)CLIntercept::config(this);
    if ((((ulong)(((CLIntercept *)tickStart.__d.__r)->m_Dispatch).clCreateContextFromType & 1) != 0)
       || (in_stack_fffffffffffffe38.__d.__r = (duration)CLIntercept::config(this),
          (((SConfig *)in_stack_fffffffffffffe38.__d.__r)->ChromeCallLogging & 1U) != 0)) {
      local_e1._33_8_ = std::chrono::_V2::steady_clock::now();
      local_a8 = local_e1._33_8_;
      in_stack_fffffffffffffe30 = (CLIntercept *)CLIntercept::config(this);
      if ((((ulong)(in_stack_fffffffffffffe30->m_Dispatch).clCreateContextFromType & 1) != 0) &&
         (in_stack_fffffffffffffe2f =
               CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)functionName),
         (bool)in_stack_fffffffffffffe2f)) {
        in_stack_fffffffffffffe20 = (CLIntercept *)local_e1;
        in_stack_fffffffffffffe18 = this;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_e1 + 1),"",(allocator *)in_stack_fffffffffffffe20);
        local_118._40_8_ = local_a0;
        local_118._32_8_ = local_a8;
        end.__d.__r._4_4_ = cVar1;
        end.__d.__r._0_4_ = in_stack_fffffffffffffe48;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)tickStart.__d.__r,(char *)in_stack_fffffffffffffe38.__d.__r,
                   (string *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe50,end);
        std::__cxx11::string::~string((string *)(local_e1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_e1);
      }
    }
    this_01 = (CLIntercept *)CLIntercept::config(this);
    if ((((((this_01->m_Mutex).super___mutex_base._M_mutex.__size[0x13] & 1U) != 0) ||
         (in_stack_fffffffffffffe08 = CLIntercept::config(this),
         (in_stack_fffffffffffffe08->ErrorAssert & 1U) != 0)) ||
        (in_stack_fffffffffffffe00 = CLIntercept::config(this),
        (in_stack_fffffffffffffe00->NoErrors & 1U) != 0)) && (local_b4 != 0)) {
      in_stack_fffffffffffffdf8 = CLIntercept::config(this);
      if ((in_stack_fffffffffffffdf8->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(this_00,functionName,in_stack_ffffffffffffff94);
      }
      in_stack_fffffffffffffdf0 = CLIntercept::config(this);
      if ((in_stack_fffffffffffffdf0->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar2 = CLIntercept::config(this);
      if ((pSVar2->NoErrors & 1U) != 0) {
        local_b4 = 0;
      }
    }
    num_sync_points_in_wait_list_00 = (cl_uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    if (((local_b4 == 0) && (in_RDI != (CLIntercept *)0x0)) &&
       (pSVar2 = CLIntercept::config(this), (pSVar2->DumpCommandBuffers & 1U) != 0)) {
      in_stack_fffffffffffffdc8 = this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"",&local_119);
      CLIntercept::recordCommandBufferCommand
                (in_stack_fffffffffffffe20,(cl_command_buffer_khr)in_stack_fffffffffffffe18,
                 (char *)this_01,(string *)in_stack_fffffffffffffe08,num_sync_points_in_wait_list_00
                 ,(cl_sync_point_khr *)in_stack_fffffffffffffdf8,
                 (cl_sync_point_khr *)in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      in_stack_fffffffffffffdd0 = in_RDI;
    }
    includeId = (undefined1)((ulong)in_stack_fffffffffffffe18 >> 0x38);
    pSVar2 = CLIntercept::config(this);
    if ((pSVar2->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (this_01,&in_stack_fffffffffffffe08->SuppressLogging,num_sync_points_in_wait_list_00
                 ,(cl_event *)in_stack_fffffffffffffdf8,
                 (cl_sync_point_khr *)in_stack_fffffffffffffdf0);
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"",&local_141);
      local_15c._12_8_ = local_a0;
      local_15c._4_8_ = local_a8;
      CLIntercept::chromeCallLoggingExit
                (in_stack_fffffffffffffe30,
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (string *)in_stack_fffffffffffffe20,(bool)includeId,(uint64_t)this_01,tickStart,
                 in_stack_fffffffffffffe38);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
    if ((in_stack_00000020 != (cl_mutable_command_khr *)0x0) &&
       (*in_stack_00000020 != (cl_mutable_command_khr)0x0)) {
      CLIntercept::addMutableCommandInfo
                (in_stack_fffffffffffffdd0,(cl_mutable_command_khr)in_stack_fffffffffffffdc8,
                 (cl_command_buffer_khr)pSVar2,(cl_uint)((ulong)pSVar4 >> 0x20));
    }
    local_1c = local_b4;
    std::__cxx11::string::~string(local_88);
  }
  return local_1c;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandSVMMemcpyKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    void* dst_ptr,
    const void* src_ptr,
    size_t size,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandSVMMemcpyKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p, dst_ptr = %p, src_ptr = %p, size = %zu%s",
                command_buffer,
                command_queue,
                dst_ptr,
                src_ptr,
                size,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandSVMMemcpyKHR(
                command_buffer,
                command_queue,
                properties,
                dst_ptr,
                src_ptr,
                size,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}